

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emacs.c
# Opt level: O2

el_action_t em_gosmacs_transpose(EditLine *el,wint_t c)

{
  wchar_t *pwVar1;
  el_action_t eVar2;
  
  pwVar1 = (el->el_line).cursor;
  eVar2 = '\x06';
  if ((el->el_line).buffer + 1 < pwVar1) {
    *(ulong *)(pwVar1 + -2) =
         CONCAT44((int)*(undefined8 *)(pwVar1 + -2),
                  (int)((ulong)*(undefined8 *)(pwVar1 + -2) >> 0x20));
    eVar2 = '\x04';
  }
  return eVar2;
}

Assistant:

libedit_private el_action_t
em_gosmacs_transpose(EditLine *el, wint_t c)
{

	if (el->el_line.cursor > &el->el_line.buffer[1]) {
		/* must have at least two chars entered */
		c = el->el_line.cursor[-2];
		el->el_line.cursor[-2] = el->el_line.cursor[-1];
		el->el_line.cursor[-1] = c;
		return CC_REFRESH;
	} else
		return CC_ERROR;
}